

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall
QDateTimeEdit::setCalendarWidget(QDateTimeEdit *this,QCalendarWidget *calendarWidget)

{
  QDateTimeEditPrivate *this_00;
  
  if (calendarWidget == (QCalendarWidget *)0x0) {
    setCalendarWidget();
  }
  else {
    this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
    if (this_00->calendarPopup == false) {
      setCalendarWidget();
    }
    else {
      if ((this_00->field_0x3e9 & 0x3f) != 0) {
        QDateTimeEditPrivate::initCalendarPopup(this_00,calendarWidget);
        return;
      }
      setCalendarWidget();
    }
  }
  return;
}

Assistant:

void QDateTimeEdit::setCalendarWidget(QCalendarWidget *calendarWidget)
{
    Q_D(QDateTimeEdit);
    if (Q_UNLIKELY(!calendarWidget)) {
        qWarning("QDateTimeEdit::setCalendarWidget: Cannot set a null calendar widget");
        return;
    }

    if (Q_UNLIKELY(!d->calendarPopup)) {
        qWarning("QDateTimeEdit::setCalendarWidget: calendarPopup is set to false");
        return;
    }

    if (Q_UNLIKELY(!(d->display & QDateTimeParser::DateSectionMask))) {
        qWarning("QDateTimeEdit::setCalendarWidget: no date sections specified");
        return;
    }
    d->initCalendarPopup(calendarWidget);
}